

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execBitDxEa<(moira::Instr)30,(moira::Mode)8,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  uint uVar2;
  u32 uVar3;
  ushort in_SI;
  Moira *in_RDI;
  u32 data;
  u32 ea;
  u8 b;
  int dst;
  int src;
  u32 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  byte bit;
  undefined2 in_stack_fffffffffffffff4;
  int n;
  Moira *this_00;
  
  n = CONCAT22(in_SI,in_stack_fffffffffffffff4);
  uVar2 = in_SI & 7;
  this_00 = in_RDI;
  uVar3 = readD<(moira::Size)4>
                    ((Moira *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (int)((ulong)in_RDI >> 0x20));
  bit = (byte)uVar3 & 7;
  bVar1 = readOp<(moira::Mode)8,(moira::Size)1,0ul>
                    (this_00,n,
                     (u32 *)(CONCAT44(uVar2,CONCAT13((byte)uVar3,(int3)in_stack_ffffffffffffffe8)) &
                            0xffffffff07ffffff),
                     (u32 *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (bVar1) {
    uVar3 = bit<(moira::Instr)30>(in_RDI,in_stack_ffffffffffffffe0,bit);
    prefetch<0ul>((Moira *)CONCAT44(in_stack_ffffffffffffffe4,uVar3));
    writeM<(moira::Mode)8,(moira::Size)1,4ul>
              ((Moira *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),(u32)((ulong)in_RDI >> 0x20),
               (u32)in_RDI);
  }
  return;
}

Assistant:

void
Moira::execBitDxEa(u16 opcode)
{
    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    switch (M) {

        case 0:
        {
            u8 b = readD(src) & 0b11111;
            u32 data = readD(dst);
            data = bit<I>(data, b);

            prefetch<POLLIPL>();

            sync(cyclesBit<I>(b));
            if (I != BTST) writeD(dst, data);
            break;
        }
        default:
        {
            u8 b = readD(src) & 0b111;

            u32 ea, data;
            if (!readOp<M, Byte>(dst, ea, data)) return;

            data = bit<I>(data, b);

            if (I != BTST) {
                prefetch();
                writeM<M, Byte, POLLIPL>(ea, data);
            } else {
                prefetch<POLLIPL>();
            }
        }
    }
}